

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

string * Catch::toLower(string *__return_storage_ptr__,string *s)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  toLowerInPlace(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string toLower( std::string const& s ) {
        std::string lc = s;
        toLowerInPlace( lc );
        return lc;
    }